

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O0

RefCntAutoPtr<Diligent::IShaderSourceInputStreamFactory> * __thiscall
Diligent::RefCntAutoPtr<Diligent::IShaderSourceInputStreamFactory>::operator=
          (RefCntAutoPtr<Diligent::IShaderSourceInputStreamFactory> *this,
          RefCntAutoPtr<Diligent::IShaderSourceInputStreamFactory> *AutoPtr)

{
  IShaderSourceInputStreamFactory *pObj;
  RefCntAutoPtr<Diligent::IShaderSourceInputStreamFactory> *AutoPtr_local;
  RefCntAutoPtr<Diligent::IShaderSourceInputStreamFactory> *this_local;
  
  if (this->m_pObject != AutoPtr->m_pObject) {
    pObj = Detach(AutoPtr);
    Attach(this,pObj);
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(RefCntAutoPtr&& AutoPtr) noexcept
    {
        if (m_pObject != AutoPtr.m_pObject)
            Attach(AutoPtr.Detach());

        return *this;
    }